

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::updateFtranDSE(HEkkDual *this,HVector *DSE_Vector)

{
  HighsSimplexAnalysis *in_RSI;
  HighsSimplexAnalysis *in_RDI;
  HVector *in_stack_00000008;
  double local_row_DSE_density;
  undefined4 in_stack_ffffffffffffffd8;
  HighsInt in_stack_ffffffffffffffdc;
  HVector *in_stack_ffffffffffffffe8;
  
  if (*(int *)&(in_RDI->log_options).user_callback_active == 0) {
    HighsSimplexAnalysis::simplexTimerStart
              (in_RSI,(HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
               (HighsInt)in_stack_ffffffffffffffe8);
    if ((*(byte *)(*(long *)&(((vector<char,_std::allocator<char>_> *)&in_RDI->numRow)->
                             super__Vector_base<char,_std::allocator<char>_>)._M_impl + 0xf1) & 1)
        != 0) {
      HighsSimplexAnalysis::operationRecordBefore
                (in_RSI,(HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(HVector *)in_RDI,
                 (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    HSimplexNla::unapplyBasisMatrixRowScale((HSimplexNla *)local_row_DSE_density,in_stack_00000008);
    HSimplexNla::ftranInScaledSpace
              ((HSimplexNla *)in_RSI,in_stack_ffffffffffffffe8,(double)in_RDI,
               (HighsTimerClock *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if ((*(byte *)(*(long *)&in_RDI->numRow + 0xf1) & 1) != 0) {
      HighsSimplexAnalysis::operationRecordAfter
                (in_RDI,in_stack_ffffffffffffffdc,(HVector *)0x789db5);
    }
    HighsSimplexAnalysis::simplexTimerStop
              (in_RSI,(HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
               (HighsInt)in_stack_ffffffffffffffe8);
    HEkk::updateOperationResultDensity
              ((HEkk *)(in_RDI->thread_simplex_clocks).
                       super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl
                       .super__Vector_impl_data._M_finish,
               (double)*(int *)((long)&in_RSI->timer_ + 4) *
               (double)(in_RDI->thread_factor_clocks).
                       super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl
                       .super__Vector_impl_data._M_finish,
               (double *)
               &(in_RDI->thread_simplex_clocks).
                super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
                super__Vector_impl_data._M_finish[0x142].clock_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  return;
}

Assistant:

void HEkkDual::updateFtranDSE(HVector* DSE_Vector) {
  // Compute the vector required to update DSE weights - being FTRAN
  // applied to row_ep (FTRAN-DSE)
  //
  // When solving the unscaled LP with scaled NLA, have computed
  //
  // row_ep = R\bar{B}^{-T}C_B.e_p = cb.R\bar{B}^{-T}e_p
  //
  // to get row_ep in the unscaled space.
  //
  // To update DSE weights requires \bar{B}^{-1}\bar{B}^{-T}e_p, being
  //
  // (1/cp).\bar{B}^{-1}R^{-1}(cb.R\bar{B}^{-T}e_p)
  //
  // where cb.R\bar{B}^{-T}e_p is row_ep in the unscaled space.
  //
  // Operation R^{-1} is performed here. Operation (1/cp) is performed
  // when updating weights
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  analysis->simplexTimerStart(FtranDseClock);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(kSimplexNlaFtranDse, *DSE_Vector,
                                    ekk_instance_.info_.row_DSE_density);
  // Apply R{-1}
  simplex_nla->unapplyBasisMatrixRowScale(*DSE_Vector);

  // Perform FTRAN DSE
  simplex_nla->ftranInScaledSpace(*DSE_Vector,
                                  ekk_instance_.info_.row_DSE_density,
                                  analysis->pointer_serial_factor_clocks);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaFtranDse, *DSE_Vector);
  analysis->simplexTimerStop(FtranDseClock);
  const double local_row_DSE_density =
      (double)DSE_Vector->count * inv_solver_num_row;
  ekk_instance_.updateOperationResultDensity(
      local_row_DSE_density, ekk_instance_.info_.row_DSE_density);
}